

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

bool __thiscall ftxui::ComponentBase::Active(ComponentBase *this)

{
  ComponentBase *pCVar1;
  bool bVar2;
  ComponentBase *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pCVar1 = this->parent_;
  if (pCVar1 == (ComponentBase *)0x0) {
    bVar2 = true;
  }
  else {
    (*pCVar1->_vptr_ComponentBase[4])(&local_28,pCVar1);
    bVar2 = local_28 == this;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  return bVar2;
}

Assistant:

bool ComponentBase::Active() const {
  return !parent_ || parent_->ActiveChild().get() == this;
}